

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O3

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getInstances
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          bool retrieveSubstitutions)

{
  _func_int **pp_Var1;
  TermIndexingStructure<Inferences::ALASCA::Demodulation::Lhs> local_10;
  
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastInstancesIterator>
            ((TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)&stack0xfffffffffffffff0
             ,t,retrieveSubstitutions);
  pp_Var1 = (_func_int **)
            Lib::FixedSizeAllocator<24UL>::alloc
                      ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  if (local_10._vptr_TermIndexingStructure == (_func_int **)0x0) {
    *pp_Var1 = (_func_int *)&PTR__ProxyIterator_00b2a158;
    pp_Var1[2] = (_func_int *)0x0;
    (this->super_TermIndexingStructure<Inferences::ALASCA::Demodulation::Lhs>).
    _vptr_TermIndexingStructure = pp_Var1;
    *(undefined4 *)(pp_Var1 + 1) = 1;
  }
  else {
    *(int *)(local_10._vptr_TermIndexingStructure + 1) =
         *(int *)(local_10._vptr_TermIndexingStructure + 1) + 1;
    *(undefined4 *)(pp_Var1 + 1) = 0;
    *pp_Var1 = (_func_int *)&PTR__ProxyIterator_00b2a158;
    pp_Var1[2] = (_func_int *)local_10._vptr_TermIndexingStructure;
    *(int *)(local_10._vptr_TermIndexingStructure + 1) =
         *(int *)(local_10._vptr_TermIndexingStructure + 1) + 1;
    (this->super_TermIndexingStructure<Inferences::ALASCA::Demodulation::Lhs>).
    _vptr_TermIndexingStructure = pp_Var1;
    *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    pp_Var1 = local_10._vptr_TermIndexingStructure + 1;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      (**(code **)(*local_10._vptr_TermIndexingStructure + 8))();
    }
  }
  if (local_10._vptr_TermIndexingStructure != (_func_int **)0x0) {
    pp_Var1 = local_10._vptr_TermIndexingStructure + 1;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    if (*(int *)pp_Var1 == 0) {
      (**(code **)(*local_10._vptr_TermIndexingStructure + 8))();
    }
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
            *)this;
}

Assistant:

VirtualIterator<Indexing::QueryRes<ResultSubstitutionSP, LeafData_>> getInstances(TypedTermList t, bool retrieveSubstitutions) final override
  { return pvi(getResultIterator<FastInstancesIterator>(t, retrieveSubstitutions)); }